

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_irExpression * build_ir_convert(Context_conflict *ctx,MOJOSHADER_astExpressionCast *ast)

{
  MOJOSHADER_astDataTypeType MVar1;
  int iVar2;
  MOJOSHADER_astDataType *dt;
  MOJOSHADER_astDataType *pMVar3;
  MOJOSHADER_irNode *pMVar4;
  MOJOSHADER_irExpression *pMVar5;
  
  dt = reduce_datatype(ctx,ast->datatype);
  pMVar3 = datatype_base(ctx,dt);
  MVar1 = pMVar3->type;
  iVar2 = datatype_elems(ctx,dt);
  pMVar4 = build_ir(ctx,ast->operand);
  if (pMVar4 != (MOJOSHADER_irNode *)0x0) {
    if ((pMVar4->ir).type == MOJOSHADER_IR_START_RANGE_EXPR) {
      __assert_fail("!retval || (retval->ir.type > MOJOSHADER_IR_START_RANGE_EXPR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x11ec,"MOJOSHADER_irExpression *build_ir_expr(Context *, void *)");
    }
    if (MOJOSHADER_IR_CONSTRUCT < (pMVar4->ir).type) {
      __assert_fail("!retval || (retval->ir.type < MOJOSHADER_IR_END_RANGE_EXPR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x11ed,"MOJOSHADER_irExpression *build_ir_expr(Context *, void *)");
    }
  }
  pMVar5 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
  if (pMVar5 == (MOJOSHADER_irExpression *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar5 = (MOJOSHADER_irExpression *)0x0;
  }
  else {
    (pMVar5->ir).type = MOJOSHADER_IR_CONVERT;
    (pMVar5->ir).filename = ctx->sourcefile;
    (pMVar5->ir).line = ctx->sourceline;
    (pMVar5->info).type = MVar1;
    (pMVar5->info).elements = iVar2;
    (pMVar5->eseq).stmt = (MOJOSHADER_irStatement *)pMVar4;
  }
  return pMVar5;
}

Assistant:

static MOJOSHADER_irExpression *build_ir_convert(Context *ctx, const MOJOSHADER_astExpressionCast *ast)
{
    const MOJOSHADER_astDataType *dt = reduce_datatype(ctx, ast->datatype);
    const MOJOSHADER_astDataTypeType type = datatype_base(ctx, dt)->type;
    const int elems = datatype_elems(ctx, dt);
    return new_ir_convert(ctx, build_ir_expr(ctx, ast->operand), type, elems);
}